

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)9>_> *
vkt::api::anon_unknown_1::Image::create
          (Move<vk::Handle<(vk::HandleType)9>_> *__return_storage_ptr__,Environment *env,
          Resources *param_2,Parameters *params)

{
  undefined1 local_80 [8];
  VkImageCreateInfo imageInfo;
  Parameters *params_local;
  Resources *param_1_local;
  Environment *env_local;
  
  local_80._0_4_ = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  imageInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageInfo._4_4_ = 0;
  imageInfo.pNext._0_4_ = params->flags;
  imageInfo.pNext._4_4_ = params->imageType;
  imageInfo.flags = params->format;
  imageInfo.imageType = (params->extent).width;
  imageInfo.format = (params->extent).height;
  imageInfo.extent.width = (params->extent).depth;
  imageInfo.extent.height = params->mipLevels;
  imageInfo.extent.depth = params->arraySize;
  imageInfo.mipLevels = params->samples;
  imageInfo.arrayLayers = params->tiling;
  imageInfo.samples = params->usage;
  imageInfo.tiling = VK_IMAGE_TILING_OPTIMAL;
  imageInfo.usage = 1;
  imageInfo._64_8_ = &env->queueFamilyIndex;
  imageInfo.pQueueFamilyIndices._0_4_ = params->initialLayout;
  imageInfo._80_8_ = params;
  ::vk::createImage(__return_storage_ptr__,env->vkd,env->device,(VkImageCreateInfo *)local_80,
                    env->allocationCallbacks);
  return __return_storage_ptr__;
}

Assistant:

static Move<VkImage> create (const Environment& env, const Resources&, const Parameters& params)
	{
		const VkImageCreateInfo		imageInfo	=
		{
			VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,
			DE_NULL,
			params.flags,
			params.imageType,
			params.format,
			params.extent,
			params.mipLevels,
			params.arraySize,
			params.samples,
			params.tiling,
			params.usage,
			VK_SHARING_MODE_EXCLUSIVE,		// sharingMode
			1u,								// queueFamilyIndexCount
			&env.queueFamilyIndex,			// pQueueFamilyIndices
			params.initialLayout
		};

		return createImage(env.vkd, env.device, &imageInfo, env.allocationCallbacks);
	}